

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg)

{
  string *in_RSI;
  exception *in_RDI;
  
  Catch::clara::std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__spdlog_ex_003a5c98;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(std::string msg)
    : msg_(std::move(msg))
{}